

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O3

void BatchNorm(pBox *pbox,BN *beta,BN *mean,BN *var)

{
  mydataFmt *pmVar1;
  mydataFmt *pmVar2;
  mydataFmt *pmVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  float *pfVar7;
  long lVar8;
  float fVar9;
  
  pfVar7 = pbox->pdata;
  if (pfVar7 == (float *)0x0) {
    pcVar6 = "Relu feature is NULL!!";
    lVar8 = 0x16;
  }
  else {
    pmVar1 = var->pdata;
    if (((pmVar1 != (mydataFmt *)0x0) && (pmVar2 = mean->pdata, pmVar2 != (mydataFmt *)0x0)) &&
       (pmVar3 = beta->pdata, pmVar3 != (mydataFmt *)0x0)) {
      if (0 < pbox->channel) {
        iVar5 = pbox->height * pbox->width;
        lVar8 = 0;
        do {
          fVar9 = pmVar1[lVar8] + 0.001;
          if (fVar9 < 0.0) {
            fVar9 = sqrtf(fVar9);
          }
          else {
            fVar9 = SQRT(fVar9);
          }
          if (0 < iVar5) {
            iVar4 = iVar5;
            do {
              *pfVar7 = *pfVar7 * (1.0 / fVar9) + pmVar2[lVar8] * -(1.0 / fVar9) + pmVar3[lVar8];
              pfVar7 = pfVar7 + 1;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < pbox->channel);
      }
      return;
    }
    pcVar6 = "the  BatchNorm bias is NULL!!";
    lVar8 = 0x1d;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  return;
}

Assistant:

void BatchNorm(struct pBox *pbox, struct BN *beta, struct BN *mean, struct BN *var) {
    if (pbox->pdata == NULL) {
        cout << "Relu feature is NULL!!" << endl;
        return;
    }
    if ((var->pdata == NULL) || (mean->pdata == NULL) || (beta->pdata == NULL)) {
        cout << "the  BatchNorm bias is NULL!!" << endl;
        return;
    }
    mydataFmt *pp = pbox->pdata;
    mydataFmt *vp = var->pdata;
    mydataFmt *mp = mean->pdata;
    mydataFmt *bp = beta->pdata;
    int gamma = 1;
    float epsilon = 0.001;
    long dis = pbox->width * pbox->height;
    mydataFmt temp = 0;
    for (int channel = 0; channel < pbox->channel; channel++) {
        temp = gamma / sqrt(((vp[channel]) + epsilon));
        for (int col = 0; col < dis; col++) {
            *pp = temp * (*pp) + ((bp[channel]) - temp * (mp[channel]));
            pp++;
        }
    }
}